

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeUpdateHasCentralNodeChild(ImGuiDockNode *node)

{
  ImGuiDockNode *pIVar1;
  ImGuiDockNode **ppIVar2;
  
  node->field_0xc5 = node->field_0xc5 & 0xbf;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateHasCentralNodeChild(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateHasCentralNodeChild(node->ChildNodes[1]);
  }
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    ppIVar2 = &node->CentralNode;
    while (pIVar1 = *ppIVar2, pIVar1 != (ImGuiDockNode *)0x0) {
      pIVar1->field_0xc5 = pIVar1->field_0xc5 | 0x40;
      ppIVar2 = &pIVar1->ParentNode;
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdateHasCentralNodeChild(ImGuiDockNode* node)
{
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateHasCentralNodeChild(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateHasCentralNodeChild(node->ChildNodes[1]);
    if (node->IsRootNode())
    {
        ImGuiDockNode* mark_node = node->CentralNode;
        while (mark_node)
        {
            mark_node->HasCentralNodeChild = true;
            mark_node = mark_node->ParentNode;
        }
    }
}